

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void appendAllPathElements(DbPath *pPath,char *zPath)

{
  char *__src;
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  long lVar5;
  char *pcVar6;
  undefined8 uVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  stat buf;
  undefined1 local_10c8 [24];
  uint local_10b0;
  char local_1038 [4104];
  
  iVar10 = 0;
  do {
    __src = zPath + iVar10;
    for (lVar9 = 0; (__src[lVar9] != '\0' && (__src[lVar9] != '/')); lVar9 = lVar9 + 1) {
    }
    uVar2 = (uint)lVar9;
    if (iVar10 < (int)(iVar10 + uVar2)) {
      if (zPath[iVar10] == '.') {
        if (uVar2 != 1) {
          if ((uVar2 != 2) || (__src[1] != '.')) goto LAB_001472fb;
          if (1 < pPath->nUsed) {
            iVar3 = pPath->nUsed;
            pcVar6 = pPath->zOut + iVar3;
            do {
              iVar3 = iVar3 + -1;
              pcVar6 = pcVar6 + -1;
              pPath->nUsed = iVar3;
            } while (*pcVar6 != '/');
            goto LAB_001473e2;
          }
          goto LAB_001473db;
        }
      }
      else {
LAB_001472fb:
        iVar3 = pPath->nUsed;
        if ((int)(iVar3 + uVar2 + 2) < pPath->nOut) {
          pPath->nUsed = iVar3 + 1;
          pPath->zOut[iVar3] = '/';
          memcpy(pPath->zOut + pPath->nUsed,__src,(long)(int)uVar2);
          iVar3 = pPath->nUsed + uVar2;
          pPath->nUsed = iVar3;
          if (pPath->rc == 0) {
            pPath->zOut[iVar3] = '\0';
            pcVar6 = pPath->zOut;
            iVar3 = (*aSyscall[0x1b].pCurrent)(pcVar6,local_10c8);
            if (iVar3 == 0) {
              if ((local_10b0 & 0xf000) == 0xa000) {
                iVar3 = pPath->nSymlink;
                pPath->nSymlink = iVar3 + 1;
                if (200 < iVar3) {
                  sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xa888,
                              "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
                  goto LAB_00147442;
                }
                lVar5 = (*aSyscall[0x1a].pCurrent)(pcVar6,local_1038,0x1000);
                if (lVar5 - 0x1000U < 0xfffffffffffff001) {
                  sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xa88d,
                              "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
                  puVar4 = (uint *)__errno_location();
                  uVar1 = *puVar4;
                  if (pcVar6 == (char *)0x0) {
                    pcVar6 = "";
                  }
                  uVar7 = 0xa88d;
                  pcVar8 = "readlink";
                  goto LAB_001473d2;
                }
                local_1038[lVar5] = '\0';
                iVar3 = 0;
                if (local_1038[0] != '/') {
                  iVar3 = ~uVar2 + pPath->nUsed;
                }
                pPath->nUsed = iVar3;
                appendAllPathElements(pPath,local_1038);
              }
            }
            else {
              puVar4 = (uint *)__errno_location();
              if (*puVar4 != 2) {
                sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xa882,
                            "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
                uVar1 = *puVar4;
                if (pcVar6 == (char *)0x0) {
                  pcVar6 = "";
                }
                uVar7 = 0xa882;
                pcVar8 = "lstat";
LAB_001473d2:
                sqlite3_log(0xe,"os_unix.c:%d: (%d) %s(%s) - %s",uVar7,(ulong)uVar1,pcVar8,pcVar6,""
                           );
LAB_00147442:
                pPath->rc = 0xe;
              }
            }
          }
        }
        else {
LAB_001473db:
          pPath->rc = 1;
        }
      }
    }
LAB_001473e2:
    iVar10 = iVar10 + uVar2 + 1;
    if (__src[lVar9] == '\0') {
      return;
    }
  } while( true );
}

Assistant:

static void appendAllPathElements(
  DbPath *pPath,       /* Path under construction, to which to append zName */
  const char *zPath    /* Path to append to pPath.  Is zero-terminated */
){
  int i = 0;
  int j = 0;
  do{
    while( zPath[i] && zPath[i]!='/' ){ i++; }
    if( i>j ){
      appendOnePathElement(pPath, &zPath[j], i-j);
    }
    j = i+1;
  }while( zPath[i++] );
}